

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall Divide<1,_0,_1>::propagate(Divide<1,_0,_1> *this)

{
  bool bVar1;
  Reason *this_00;
  IntView<1> *in_RDI;
  Reason m_r_5;
  int64_t m_v_5;
  Reason m_r_4;
  int64_t m_v_4;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  int64_t z_max;
  int64_t z_min;
  int64_t y_max;
  int64_t y_min;
  int64_t x_max;
  int64_t x_min;
  IntView<0> *in_stack_ffffffffffffff00;
  Lit in_stack_ffffffffffffff08;
  Lit in_stack_ffffffffffffff0c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff10;
  Reason *in_stack_ffffffffffffff18;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff20;
  anon_union_8_2_743a5d44_for_Reason_0 local_d0;
  long local_c8;
  anon_union_8_2_743a5d44_for_Reason_0 local_c0;
  int local_b8;
  int local_b4;
  anon_union_8_2_743a5d44_for_Reason_0 local_b0;
  long local_a8;
  anon_union_8_2_743a5d44_for_Reason_0 local_a0;
  int local_98;
  int local_94;
  anon_union_8_2_743a5d44_for_Reason_0 local_90;
  long local_88;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  int local_78;
  int local_74;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  long local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  int local_58;
  int local_54;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  long local_48;
  int64_t local_40;
  int64_t local_38;
  int64_t local_30;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  
  local_18 = IntView<1>::getMin((IntView<1> *)in_stack_ffffffffffffff00);
  local_20 = IntView<1>::getMax((IntView<1> *)in_stack_ffffffffffffff00);
  local_28 = IntView<0>::getMin(in_stack_ffffffffffffff00);
  local_30 = IntView<0>::getMax(in_stack_ffffffffffffff00);
  local_38 = IntView<1>::getMin((IntView<1> *)in_stack_ffffffffffffff00);
  local_40 = IntView<1>::getMax((IntView<1> *)in_stack_ffffffffffffff00);
  local_48 = (local_18 + local_30 + -1) / local_30;
  bVar1 = IntView<1>::setMinNotR((IntView<1> *)in_stack_ffffffffffffff00,(int64_t)in_RDI);
  if (bVar1) {
    Reason::Reason((Reason *)&local_50,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_54 = (int)IntView<1>::getMinLit(in_RDI);
      local_58 = (int)IntView<0>::getMaxLit((IntView<0> *)in_RDI);
      Reason::Reason(in_stack_ffffffffffffff18,(Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     (Lit)(int)in_stack_ffffffffffffff20._a);
    }
    local_60 = local_50;
    bVar1 = IntView<1>::setMin((IntView<1> *)
                               CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                               (int64_t)in_stack_ffffffffffffff00,(Reason)in_stack_ffffffffffffff10,
                               SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  local_68 = (local_20 + local_28 + -1) / local_28;
  bVar1 = IntView<1>::setMaxNotR((IntView<1> *)in_stack_ffffffffffffff00,(int64_t)in_RDI);
  if (bVar1) {
    Reason::Reason((Reason *)&local_70,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_74 = (int)IntView<1>::getMaxLit(in_RDI);
      local_78 = (int)IntView<0>::getMinLit((IntView<0> *)in_RDI);
      Reason::Reason(in_stack_ffffffffffffff18,(Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     (Lit)(int)in_stack_ffffffffffffff20._a);
    }
    local_80 = local_70;
    bVar1 = IntView<1>::setMax((IntView<1> *)
                               CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                               (int64_t)in_stack_ffffffffffffff00,(Reason)in_stack_ffffffffffffff10,
                               SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  local_88 = local_28 * (local_38 + -1) + 1;
  bVar1 = IntView<1>::setMinNotR((IntView<1> *)in_stack_ffffffffffffff00,(int64_t)in_RDI);
  if (bVar1) {
    Reason::Reason((Reason *)&local_90,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_94 = (int)IntView<0>::getMinLit((IntView<0> *)in_RDI);
      local_98 = (int)IntView<1>::getMinLit(in_RDI);
      Reason::Reason(in_stack_ffffffffffffff18,(Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     (Lit)(int)in_stack_ffffffffffffff20._a);
    }
    local_a0 = local_90;
    bVar1 = IntView<1>::setMin((IntView<1> *)
                               CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                               (int64_t)in_stack_ffffffffffffff00,(Reason)in_stack_ffffffffffffff10,
                               SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  local_a8 = local_30 * local_40;
  bVar1 = IntView<1>::setMaxNotR((IntView<1> *)in_stack_ffffffffffffff00,(int64_t)in_RDI);
  if (bVar1) {
    Reason::Reason((Reason *)&local_b0,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_b4 = (int)IntView<0>::getMaxLit((IntView<0> *)in_RDI);
      local_b8 = (int)IntView<1>::getMaxLit(in_RDI);
      Reason::Reason(in_stack_ffffffffffffff18,(Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     (Lit)(int)in_stack_ffffffffffffff20._a);
    }
    local_c0 = local_b0;
    bVar1 = IntView<1>::setMax((IntView<1> *)
                               CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                               (int64_t)in_stack_ffffffffffffff00,(Reason)in_stack_ffffffffffffff10,
                               SUB81((ulong)in_RDI >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  if (0 < local_40) {
    local_c8 = (local_18 + local_40 + -1) / local_40;
    bVar1 = IntView<0>::setMinNotR(in_stack_ffffffffffffff00,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&local_d0,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<1>::getMinLit(in_RDI);
        IntView<1>::getMaxLit(in_RDI);
        Reason::Reason(in_stack_ffffffffffffff18,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff20._a);
      }
      bVar1 = IntView<0>::setMin((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                                 (int64_t)in_stack_ffffffffffffff00,
                                 (Reason)in_stack_ffffffffffffff10,SUB81((ulong)in_RDI >> 0x38,0));
      in_stack_ffffffffffffff20 = local_d0;
      if (!bVar1) {
        return false;
      }
    }
  }
  if (1 < local_38) {
    this_00 = (Reason *)((local_20 + local_38 + -2) / (local_38 + -1) + -1);
    bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffff00,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&stack0xffffffffffffff10,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        in_stack_ffffffffffffff0c = IntView<1>::getMaxLit(in_RDI);
        in_stack_ffffffffffffff08 = IntView<1>::getMinLit(in_RDI);
        Reason::Reason(this_00,(Lit)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff20._a);
      }
      bVar1 = IntView<0>::setMax((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff0c.x,in_stack_ffffffffffffff08.x),
                                 in_stack_ffffffffffffff10._a,(Reason)in_stack_ffffffffffffff10,
                                 SUB81((ulong)in_RDI >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}